

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robust_deserialization_unit.c
# Opt level: O2

void deserialize_duplicate_keys(void)

{
  char data [17];
  
  builtin_strncpy(data,";0\x01",4);
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\0';
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  data[0x10] = '\0';
  invalid_deserialize_test(data,0x11,"overlapping keys");
  return;
}

Assistant:

DEFINE_TEST(deserialize_duplicate_keys) {
    // clang-format off
    const char data[] = {
        0x3B, 0x30, // Serial Cookie
        1, 0,       // Container count - 1
        0,          // Run Flag Bitset (no runs)
        0, 0,       // Upper 16 bits of the first container
        0, 0,       // Cardinality - 1 of the first container
        0, 0,       // Upper 16 bits of the second container - DUPLICATE
        0, 0,       // Cardinality - 1 of the second container
        0, 0,       // Only value of first container
        0, 0,       // Only value of second container
    };
    // clang-format on
    invalid_deserialize_test(data, sizeof(data), "overlapping keys");
}